

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O1

void ImGui_ImplGlfw_CursorPosCallback(GLFWwindow *window,double x,double y)

{
  int iVar1;
  ImGuiContext *pIVar2;
  ImGuiIO *pIVar3;
  long *plVar4;
  
  pIVar2 = ImGui::GetCurrentContext();
  if (pIVar2 == (ImGuiContext *)0x0) {
    plVar4 = (long *)0x0;
  }
  else {
    pIVar3 = ImGui::GetIO();
    plVar4 = (long *)pIVar3->BackendPlatformUserData;
  }
  if (((code *)plVar4[0x10] != (code *)0x0) && ((GLFWwindow *)*plVar4 == window)) {
    (*(code *)plVar4[0x10])(x,y,window);
  }
  iVar1 = glfwGetInputMode(window,0x33001);
  if (iVar1 != 0x34003) {
    pIVar3 = ImGui::GetIO();
    ImGuiIO::AddMousePosEvent(pIVar3,(float)x,(float)y);
    *(float *)(plVar4 + 0xd) = (float)x;
    *(float *)((long)plVar4 + 0x6c) = (float)y;
  }
  return;
}

Assistant:

void ImGui_ImplGlfw_CursorPosCallback(GLFWwindow* window, double x, double y)
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    if (bd->PrevUserCallbackCursorPos != nullptr && window == bd->Window)
        bd->PrevUserCallbackCursorPos(window, x, y);
    if (glfwGetInputMode(window, GLFW_CURSOR) == GLFW_CURSOR_DISABLED)
        return;

    ImGuiIO& io = ImGui::GetIO();
    io.AddMousePosEvent((float)x, (float)y);
    bd->LastValidMousePos = ImVec2((float)x, (float)y);
}